

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O0

void __thiscall S2CellIndex::RangeIterator::Seek(RangeIterator *this,S2CellId target)

{
  bool bVar1;
  ostream *poVar2;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<const_S2CellIndex::RangeNode_*,_std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>_>
  _Var3;
  __normal_iterator<const_S2CellIndex::RangeNode_*,_std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>_>
  local_58 [4];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  RangeIterator *local_18;
  RangeIterator *this_local;
  S2CellId target_local;
  
  local_18 = this;
  this_local = (RangeIterator *)target.id_;
  bVar1 = S2CellId::is_leaf((S2CellId *)&this_local);
  local_31 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc"
               ,0x19,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar2 = S2LogMessage::stream(&local_30);
    poVar2 = std::operator<<(poVar2,"Check failed: target.is_leaf() ");
    S2LogMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  __first = std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>::begin
                      (this->range_nodes_);
  __last = std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>::end
                     (this->range_nodes_);
  local_58[0] = std::
                upper_bound<__gnu_cxx::__normal_iterator<S2CellIndex::RangeNode_const*,std::vector<S2CellIndex::RangeNode,std::allocator<S2CellIndex::RangeNode>>>,S2CellId>
                          (__first._M_current,__last._M_current,(S2CellId *)&this_local);
  _Var3 = __gnu_cxx::
          __normal_iterator<const_S2CellIndex::RangeNode_*,_std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>_>
          ::operator-(local_58,1);
  (this->it_)._M_current = _Var3._M_current;
  return;
}

Assistant:

void S2CellIndex::RangeIterator::Seek(S2CellId target) {
  S2_DCHECK(target.is_leaf());
  it_ = std::upper_bound(range_nodes_->begin(), range_nodes_->end(),
                         target) - 1;
}